

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O1

void uploadLH(int n_vert,float *buffer)

{
  float *data;
  ulong uVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  
  data = (float *)operator_new__(0x38400000);
  if (0 < n_vert) {
    uVar1 = 0;
    pfVar2 = data;
    do {
      lVar4 = 0;
      pfVar3 = pfVar2;
      do {
        *pfVar3 = buffer[lVar4];
        lVar4 = lVar4 + 1;
        pfVar3 = pfVar3 + 0x100000;
      } while (lVar4 != 0xe1);
      uVar1 = uVar1 + 1;
      buffer = buffer + 0xe1;
      pfVar2 = pfVar2 + 1;
    } while (uVar1 != (uint)n_vert);
  }
  (*glad_glActiveTexture)(0x84c8);
  create_2D_float_texture_array(0x400,0x400,1,0xe1,data,0x2600,false);
  operator_delete__(data);
  return;
}

Assistant:

void uploadLH(int n_vert, const float* buffer)
{
	float* texdata = new float[1024 * 1024 * N_COEFFS];
	for (int i=0; i<n_vert; ++i)
		for (int j=0; j<N_COEFFS; ++j)
			texdata[j*1024*1024+i] = buffer[i*N_COEFFS+j];
	glActiveTexture(GL_TEXTURE8);
	create_2D_float_texture_array(1024, 1024, 1, N_COEFFS, texdata, GL_NEAREST);
	delete[] texdata;
}